

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wifi_impl.cpp
# Opt level: O0

bool __thiscall ui::anon_unknown_0::WiFiImpl::WifiStatus(WiFiImpl *this)

{
  int iVar1;
  int flags;
  int err;
  ifreq req;
  char *ifname;
  int skfd;
  WiFiImpl *this_local;
  
  iVar1 = socket(2,2,0);
  if (iVar1 < 0) {
    this_local._7_1_ = false;
  }
  else {
    req.ifr_ifru._16_8_ = (long)"/sys/class/net/wlan0" + 0xf;
    strncpy((char *)&flags,"wlan0",0x10);
    iVar1 = ioctl(iVar1,0x8913,&flags);
    if (iVar1 == 0) {
      this_local._7_1_ = (bool)(-(req.ifr_ifrn.ifrn_name[8] & 1U) & 1);
    }
    else {
      perror("SIOCGIFFLAGS");
      this_local._7_1_ = iVar1 != 0;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool WifiStatus() {
    int skfd = socket(AF_INET, SOCK_DGRAM, 0);

    if (skfd < 0) {
      return 0;
    }

    const char* ifname = "wlan0";
    struct ifreq req;

    strncpy(req.ifr_ifrn.ifrn_name, ifname, IFNAMSIZ);

    int err = ioctl(skfd, SIOCGIFFLAGS, &req);
    if (err) {
      perror("SIOCGIFFLAGS");
      return err;
    } else {
      int flags = req.ifr_ifru.ifru_flags;
      return (flags & IFF_UP) ? true : false;
    }
    return 0;
  }